

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

char * peparse::GetSymbolTableStorageClassName(uint8_t id)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,id);
  switch(iVar1) {
  case 0:
    return "CLASS_NULL";
  case 1:
    return "CLASS_AUTOMATIC";
  case 2:
    return "CLASS_EXTERNAL";
  case 3:
    return "CLASS_STATIC";
  case 4:
    return "CLASS_REGISTER";
  case 5:
    return "CLASS_EXTERNAL_DEF";
  case 6:
    return "CLASS_LABEL";
  case 7:
    return "CLASS_UNDEFINED_LABEL";
  case 8:
    return "CLASS_MEMBER_OF_STRUCT";
  case 9:
    return "CLASS_ARGUMENT";
  case 10:
    return "CLASS_STRUCT_TAG";
  case 0xb:
    return "CLASS_MEMBER_OF_UNION";
  case 0xc:
    return "CLASS_UNION_TAG";
  case 0xd:
    return "CLASS_TYPE_DEFINITION";
  case 0xe:
    return "CLASS_UNDEFINED_STATIC";
  case 0xf:
    return "CLASS_ENUM_TAG";
  case 0x10:
    return "CLASS_MEMBER_OF_ENUM";
  case 0x11:
    return "CLASS_REGISTER_PARAM";
  case 0x12:
    return "CLASS_BIT_FIELD";
  }
  switch(iVar1) {
  case 100:
    return "CLASS_BLOCK";
  case 0x65:
    return "CLASS_FUNCTION";
  case 0x66:
    return "CLASS_END_OF_STRUCT";
  case 0x67:
    return "CLASS_FILE";
  case 0x68:
    return "CLASS_SECTION";
  case 0x69:
    return "CLASS_WEAK_EXTERNAL";
  case 0x6a:
    goto switchD_00110b4e_caseD_6a;
  case 0x6b:
    return "CLASS_CLR_TOKEN";
  default:
    if (iVar1 == 0xff) {
      return "CLASS_END_OF_FUNCTION";
    }
switchD_00110b4e_caseD_6a:
    return (char *)0x0;
  }
}

Assistant:

const char *GetSymbolTableStorageClassName(std::uint8_t id) {
  switch (id) {
    case IMAGE_SYM_CLASS_END_OF_FUNCTION:
      return "CLASS_END_OF_FUNCTION";
    case IMAGE_SYM_CLASS_NULL:
      return "CLASS_NULL";
    case IMAGE_SYM_CLASS_AUTOMATIC:
      return "CLASS_AUTOMATIC";
    case IMAGE_SYM_CLASS_EXTERNAL:
      return "CLASS_EXTERNAL";
    case IMAGE_SYM_CLASS_STATIC:
      return "CLASS_STATIC";
    case IMAGE_SYM_CLASS_REGISTER:
      return "CLASS_REGISTER";
    case IMAGE_SYM_CLASS_EXTERNAL_DEF:
      return "CLASS_EXTERNAL_DEF";
    case IMAGE_SYM_CLASS_LABEL:
      return "CLASS_LABEL";
    case IMAGE_SYM_CLASS_UNDEFINED_LABEL:
      return "CLASS_UNDEFINED_LABEL";
    case IMAGE_SYM_CLASS_MEMBER_OF_STRUCT:
      return "CLASS_MEMBER_OF_STRUCT";
    case IMAGE_SYM_CLASS_ARGUMENT:
      return "CLASS_ARGUMENT";
    case IMAGE_SYM_CLASS_STRUCT_TAG:
      return "CLASS_STRUCT_TAG";
    case IMAGE_SYM_CLASS_MEMBER_OF_UNION:
      return "CLASS_MEMBER_OF_UNION";
    case IMAGE_SYM_CLASS_UNION_TAG:
      return "CLASS_UNION_TAG";
    case IMAGE_SYM_CLASS_TYPE_DEFINITION:
      return "CLASS_TYPE_DEFINITION";
    case IMAGE_SYM_CLASS_UNDEFINED_STATIC:
      return "CLASS_UNDEFINED_STATIC";
    case IMAGE_SYM_CLASS_ENUM_TAG:
      return "CLASS_ENUM_TAG";
    case IMAGE_SYM_CLASS_MEMBER_OF_ENUM:
      return "CLASS_MEMBER_OF_ENUM";
    case IMAGE_SYM_CLASS_REGISTER_PARAM:
      return "CLASS_REGISTER_PARAM";
    case IMAGE_SYM_CLASS_BIT_FIELD:
      return "CLASS_BIT_FIELD";
    case IMAGE_SYM_CLASS_BLOCK:
      return "CLASS_BLOCK";
    case IMAGE_SYM_CLASS_FUNCTION:
      return "CLASS_FUNCTION";
    case IMAGE_SYM_CLASS_END_OF_STRUCT:
      return "CLASS_END_OF_STRUCT";
    case IMAGE_SYM_CLASS_FILE:
      return "CLASS_FILE";
    case IMAGE_SYM_CLASS_SECTION:
      return "CLASS_SECTION";
    case IMAGE_SYM_CLASS_WEAK_EXTERNAL:
      return "CLASS_WEAK_EXTERNAL";
    case IMAGE_SYM_CLASS_CLR_TOKEN:
      return "CLASS_CLR_TOKEN";
    default:
      return nullptr;
  }
}